

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<diy::BlockID*,std::vector<diy::BlockID,std::allocator<diy::BlockID>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (undefined8 *__result,int *__a,int *__b,int *__c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  
  iVar1 = *__a;
  iVar2 = *__b;
  iVar3 = *__c;
  if (iVar2 <= iVar1) {
    if (iVar1 < iVar3) {
      uVar4 = *__result;
      *__result = *(undefined8 *)__a;
      *(undefined8 *)__a = uVar4;
      return;
    }
    uVar4 = *__result;
    if (iVar2 < iVar3) {
      *__result = *(undefined8 *)__c;
      *(undefined8 *)__c = uVar4;
      return;
    }
    *__result = *(undefined8 *)__b;
    *(undefined8 *)__b = uVar4;
    return;
  }
  if (iVar2 < iVar3) {
    uVar4 = *__result;
    *__result = *(undefined8 *)__b;
    *(undefined8 *)__b = uVar4;
    return;
  }
  uVar4 = *__result;
  if (iVar1 < iVar3) {
    *__result = *(undefined8 *)__c;
    *(undefined8 *)__c = uVar4;
    return;
  }
  *__result = *(undefined8 *)__a;
  *(undefined8 *)__a = uVar4;
  return;
}

Assistant:

inline
    bool
    operator==(const diy::BlockID& x, const diy::BlockID& y)
    { return x.gid == y.gid; }